

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<unsigned_long>::emplace_back_impl<unsigned_long>
          (QVLABase<unsigned_long> *this,qsizetype prealloc,void *array,unsigned_long *args)

{
  QVLABase<unsigned_long> *this_00;
  QVLABase<unsigned_long> *pQVar1;
  iterator ptr;
  unsigned_long *puVar2;
  unsigned_long *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<unsigned_long> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<unsigned_long> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<unsigned_long> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  puVar2 = q20::construct_at<unsigned_long,unsigned_long,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return puVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }